

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

void loader_impl_destroy_deallocate(loader_impl impl)

{
  void *in_RDI;
  
  set_iterate(*(undefined8 *)((long)in_RDI + 0x48),loader_impl_destroy_exec_path_map_cb_iterate,0);
  set_destroy(*(undefined8 *)((long)in_RDI + 0x48));
  context_destroy(*(undefined8 *)((long)in_RDI + 0x30));
  if (*(long *)((long)in_RDI + 0x40) != 0) {
    value_type_destroy(*(undefined8 *)((long)in_RDI + 0x40));
  }
  free(in_RDI);
  return;
}

Assistant:

void loader_impl_destroy_deallocate(loader_impl impl)
{
	set_iterate(impl->exec_path_map, &loader_impl_destroy_exec_path_map_cb_iterate, NULL);

	set_destroy(impl->exec_path_map);

	context_destroy(impl->ctx);

	if (impl->options != NULL)
	{
		value_type_destroy(impl->options);
	}

	free(impl);
}